

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

remove_cvref_t<fmt::v11::basic_appender<char>_> __thiscall
fmt::v11::formatter<std::complex<double>,_char,_void>::format<fmt::v11::context>
          (formatter<std::complex<double>,_char,_void> *this,complex<double> *value,context *ctx)

{
  remove_cvref_t<fmt::v11::basic_appender<char>_&> rVar1;
  string_view fmt;
  format_args args;
  basic_appender<char> local_30;
  undefined8 local_28 [2];
  undefined8 local_18;
  
  local_30.container = (ctx->out_).container;
  local_28[0] = *(undefined8 *)value->_M_value;
  local_18 = *(undefined8 *)(value->_M_value + 8);
  fmt.size_ = 7;
  fmt.data_ = "[{},{}]";
  args.field_1.values_ = (value<fmt::v11::context> *)local_28;
  args.desc_ = 0xaa;
  rVar1 = vformat_to<fmt::v11::basic_appender<char>_&,_0>(&local_30,fmt,args);
  return (remove_cvref_t<fmt::v11::basic_appender<char>_>)rVar1.container;
}

Assistant:

auto format(const std::complex<double>& value, FormatContext& ctx) const
    {
        // ctx.out() is an output iterator to write to.
        // return format(ctx.out(), "[{},{}]",p.real(), p.imag());
        return fmt::format_to(ctx.out(), "[{},{}]", value.real(), value.imag());
    }